

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

void advance(ParserState *ps)

{
  Token TVar1;
  char *local_18;
  char *err;
  ParserState *ps_local;
  
  local_18 = (char *)0x0;
  (ps->lasttoktext).ptr = (ps->toktext).ptr;
  (ps->lasttoktext).len = (ps->toktext).len;
  err = (char *)ps;
  TVar1 = lex(&ps->currtext,&ps->toktext,&local_18);
  *(Token *)(err + 0x10) = TVar1;
  if (*(int *)(err + 0x10) == 7) {
    error((ParserState *)err,local_18,*(ptrlen *)(err + 0x18));
  }
  return;
}

Assistant:

static void advance(ParserState *ps)
{
    char *err = NULL;
    ps->lasttoktext = ps->toktext;
    ps->tok = lex(&ps->currtext, &ps->toktext, &err);
    if (ps->tok == TOK_ERROR)
        error(ps, err, ps->toktext);
}